

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

ON_ModelComponentReference __thiscall
ONX_Model::FirstDimensionStyleFromFont
          (ONX_Model *this,ON_Font *font,double model_space_text_scale,bool bIgnoreSystemDimStyles)

{
  uint uVar1;
  ON_Font *this_00;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ON_ModelComponentReference OVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  if ((ON_Font *)CONCAT71(in_register_00000011,bIgnoreSystemDimStyles) != (ON_Font *)0x0) {
    this_00 = ON_Font::ManagedFont((ON_Font *)CONCAT71(in_register_00000011,bIgnoreSystemDimStyles))
    ;
    if (this_00 != (ON_Font *)0x0) {
      uVar1 = ON_Font::ManagedFontSerialNumber(this_00);
      if (uVar1 != 0) {
        OVar3 = FirstDimensionStyleFromManagedFontSerialNumber
                          (this,(uint)font,model_space_text_scale,SUB41(uVar1,0));
        _Var2._M_pi = OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        goto LAB_00460f85;
      }
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
             ,0x452,"","Invalid font parameter");
  ON_ModelComponentReference::ON_ModelComponentReference
            ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
  _Var2._M_pi = extraout_RDX;
LAB_00460f85:
  OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar3.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::FirstDimensionStyleFromFont(
  const ON_Font* font,
  double model_space_text_scale,
  bool bIgnoreSystemDimStyles
  ) const
{
  const ON_Font* managed_font
    = (nullptr != font)
    ? font->ManagedFont()
    : nullptr;

  const unsigned int managed_font_sn
    = (nullptr != managed_font)
    ? managed_font->ManagedFontSerialNumber()
    : 0;

  if ( 0 == managed_font_sn )
  {
    ON_ERROR("Invalid font parameter");
    return ON_ModelComponentReference::Empty;
  }

  return FirstDimensionStyleFromManagedFontSerialNumber(managed_font_sn, model_space_text_scale, bIgnoreSystemDimStyles);
}